

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O1

void Saig_MvManStop(Saig_MvMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  int *__ptr;
  
  Aig_MmFixedStop(p->pMemStates,0);
  pVVar1 = p->vStates;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p->vXFlops != (Vec_Int_t *)0x0) {
    __ptr = p->vXFlops->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vXFlops->pArray = (int *)0x0;
    }
    if (p->vXFlops != (Vec_Int_t *)0x0) {
      free(p->vXFlops);
      p->vXFlops = (Vec_Int_t *)0x0;
    }
  }
  pVVar1 = p->vFlops;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTired;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (*p->pRegsValues != (int *)0x0) {
    free(*p->pRegsValues);
    *p->pRegsValues = (int *)0x0;
  }
  if (p->pRegsValues != (int **)0x0) {
    free(p->pRegsValues);
    p->pRegsValues = (int **)0x0;
  }
  if (p->nRegsValues != (int *)0x0) {
    free(p->nRegsValues);
    p->nRegsValues = (int *)0x0;
  }
  if (p->pRegsUndef != (int *)0x0) {
    free(p->pRegsUndef);
    p->pRegsUndef = (int *)0x0;
  }
  if (p->pAigOld != (Saig_MvObj_t *)0x0) {
    free(p->pAigOld);
    p->pAigOld = (Saig_MvObj_t *)0x0;
  }
  if (p->pTStates != (uint *)0x0) {
    free(p->pTStates);
    p->pTStates = (uint *)0x0;
  }
  if (p->pAigNew != (Saig_MvAnd_t *)0x0) {
    free(p->pAigNew);
    p->pAigNew = (Saig_MvAnd_t *)0x0;
  }
  if (p->pTNodes != (int *)0x0) {
    free(p->pTNodes);
    p->pTNodes = (int *)0x0;
  }
  if (p->pLevels != (uchar *)0x0) {
    free(p->pLevels);
    p->pLevels = (uchar *)0x0;
  }
  if (p != (Saig_MvMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Saig_MvManStop( Saig_MvMan_t * p )
{
    Aig_MmFixedStop( p->pMemStates, 0 );
    Vec_PtrFree( p->vStates );
    Vec_IntFreeP( &p->vXFlops );
    Vec_PtrFree( p->vFlops );
    Vec_PtrFree( p->vTired );
    ABC_FREE( p->pRegsValues[0] );
    ABC_FREE( p->pRegsValues );
    ABC_FREE( p->nRegsValues );
    ABC_FREE( p->pRegsUndef );
    ABC_FREE( p->pAigOld );
    ABC_FREE( p->pTStates );
    ABC_FREE( p->pAigNew );
    ABC_FREE( p->pTNodes );
    ABC_FREE( p->pLevels );
    ABC_FREE( p );
}